

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE.c
# Opt level: O0

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                   char *opt_mname,void *buf_ptr,size_t size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  long *in_RDX;
  long extraout_RDX;
  long in_RSI;
  undefined8 in_RDI;
  char *in_R8;
  ulong in_R9;
  asn_dec_rval_t aVar5;
  size_t num_6;
  size_t num_5;
  size_t num_4;
  size_t num_3;
  size_t num_2;
  size_t num_1;
  size_t num;
  void **memb_ptr2;
  void *memb_ptr;
  asn_dec_rval_t tmprval;
  int n;
  asn_TYPE_member_t *elm;
  xer_check_tag_e tcv;
  ssize_t ch_size;
  pxer_chunk_type_e ch_type;
  int edx_end;
  int edx;
  ssize_t consumed_myself;
  asn_struct_ctx_t *ctx;
  void *st;
  char *xml_tag;
  asn_TYPE_member_t *elements;
  asn_SEQUENCE_specifics_t *specs;
  asn_dec_rval_t rval;
  int local_16c;
  uint local_164;
  uint local_15c;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  void *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  long local_110;
  undefined4 uStack_cc;
  long *local_c0;
  long local_b8;
  undefined8 local_b0;
  long local_a8;
  uint local_9c;
  uint *local_98;
  xer_check_tag_e local_8c;
  ssize_t local_88;
  int local_7c;
  uint local_78;
  uint local_74;
  size_t local_70;
  short *local_68;
  void *local_60;
  long local_58;
  long local_50;
  int *local_48;
  ulong local_40;
  char *local_38;
  long *local_28;
  long local_20;
  undefined8 local_18;
  uint local_10;
  size_t local_8;
  
  local_48 = *(int **)(in_RSI + 0x98);
  local_50 = *(long *)(in_RSI + 0x88);
  local_110 = in_RCX;
  if (in_RCX == 0) {
    local_110 = *(long *)(in_RSI + 8);
  }
  local_58 = local_110;
  local_60 = (void *)*in_RDX;
  local_70 = 0;
  local_40 = in_R9;
  local_38 = in_R8;
  local_20 = in_RSI;
  local_18 = in_RDI;
  if (local_60 == (void *)0x0) {
    local_28 = in_RDX;
    local_60 = calloc(1,(long)*local_48);
    *local_28 = (long)local_60;
    if (local_60 == (void *)0x0) {
      local_10 = 2;
      local_8 = local_70;
      goto LAB_0015ae9e;
    }
  }
  local_68 = (short *)((long)local_60 + (long)local_48[1]);
  local_74 = (uint)local_68[1];
LAB_0015a300:
  do {
    if (3 < *local_68) goto LAB_0015ae76;
    if (*local_68 == 2) {
      local_98 = (uint *)(*(long *)(local_20 + 0x88) + (long)(int)local_74 * 0x40);
      if ((*local_98 & 1) == 0) {
        local_b8 = (long)local_60 + (long)(int)local_98[2];
        local_c0 = &local_b8;
      }
      else {
        local_c0 = (long *)((long)local_60 + (long)(int)local_98[2]);
      }
      local_10 = (**(code **)(*(long *)(local_98 + 6) + 0x38))
                           (local_18,*(undefined8 *)(local_98 + 6),local_c0,
                            *(undefined8 *)(local_98 + 0xe),local_38,local_40);
      local_b0 = CONCAT44(uStack_cc,local_10);
      local_38 = local_38 + extraout_RDX;
      local_40 = local_40 - extraout_RDX;
      local_70 = extraout_RDX + local_70;
      local_8 = local_70;
      if (local_10 != 0) goto LAB_0015ae9e;
      *local_68 = 1;
      local_74 = local_74 + 1;
      local_68[1] = (short)local_74;
      local_a8 = extraout_RDX;
      ASN_DEBUG("XER/SEQUENCE phase => %d, step => %d",(ulong)(uint)(int)*local_68,
                (ulong)(uint)(int)local_68[1]);
    }
    local_88 = xer_next_token(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (pxer_chunk_type_e *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (local_88 == -1) {
      local_10 = 2;
      local_8 = local_70;
      goto LAB_0015ae9e;
    }
    if (local_7c == 0) {
      local_10 = 1;
      local_8 = local_70;
      goto LAB_0015ae9e;
    }
    if ((local_7c == 1) || (1 < local_7c - 2U)) {
      local_8c = xer_check_tag((void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                               ,in_stack_fffffffffffffeb4,
                               (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                              );
      ASN_DEBUG("XER/SEQUENCE: tcv = %d, ph=%d [%s]",(ulong)local_8c,(ulong)(uint)(int)*local_68,
                local_58);
      if (*local_68 == 3) {
        iVar1 = xer_skip_unknown(local_8c,(ber_tlv_len_t *)(local_68 + 8));
        switch(iVar1) {
        case 0:
          local_38 = local_38 + local_88;
          local_40 = local_40 - local_88;
          local_70 = local_88 + local_70;
          goto LAB_0015a300;
        case 1:
          local_38 = local_38 + local_88;
          local_40 = local_40 - local_88;
          local_70 = local_88 + local_70;
          *local_68 = 1;
          goto LAB_0015a300;
        case 2:
          *local_68 = 1;
          break;
        case -1:
          *local_68 = 4;
          local_10 = 2;
          local_8 = local_70;
          goto LAB_0015ae9e;
        }
      }
      in_stack_fffffffffffffed8 = (int *)(ulong)(local_8c - XCT_OPENING);
      switch(in_stack_fffffffffffffed8) {
      case (int *)0x0:
        goto switchD_0015a7f6_caseD_0;
      case (int *)0x1:
        if (*local_68 != 0) {
          *local_68 = 0;
          goto switchD_0015a7f6_caseD_2;
        }
        goto LAB_0015ad34;
      case (int *)0x2:
        goto switchD_0015a7f6_caseD_2;
      default:
        goto switchD_0015a7f6_caseD_3;
      case (int *)0x4:
      case (int *)0x6:
        goto switchD_0015a7f6_caseD_4;
      }
    }
    local_38 = local_38 + local_88;
    local_40 = local_40 - local_88;
    local_70 = local_88 + local_70;
  } while( true );
switchD_0015a7f6_caseD_2:
  if (*local_68 == 0) {
    if ((((int)local_74 < *(int *)(local_20 + 0x90)) &&
        (local_74 + *(int *)(local_50 + (long)(int)local_74 * 0x40 + 4) != *(int *)(local_20 + 0x90)
        )) && (((int)local_74 <= local_48[10] ||
               ((local_48[0xb] <= (int)local_74 || (local_48[0xb] <= *(int *)(local_20 + 0x90)))))))
    {
      ASN_DEBUG("Premature end of XER SEQUENCE");
      local_10 = 2;
      local_8 = local_70;
    }
    else {
      local_8 = local_88 + local_70;
      *local_68 = 4;
      local_10 = 0;
    }
    goto LAB_0015ae9e;
  }
switchD_0015a7f6_caseD_0:
  if (*local_68 != 0) {
switchD_0015a7f6_caseD_4:
    ASN_DEBUG("XER/SEQUENCE: tcv=%d, ph=%d, edx=%d",(ulong)local_8c,(ulong)(uint)(int)*local_68,
              (ulong)local_74);
    if (*local_68 == 1) {
      if ((int)local_74 < *(int *)(local_20 + 0x90)) {
        local_78 = local_74 + *(int *)(local_50 + (long)(int)local_74 * 0x40 + 4) + 1;
        if (*(int *)(local_20 + 0x90) < (int)local_78) {
          local_78 = *(uint *)(local_20 + 0x90);
        }
        local_9c = local_74;
        while ((int)local_9c < (int)local_78) {
          local_98 = (uint *)(*(long *)(local_20 + 0x88) + (long)(int)local_9c * 0x40);
          local_8c = xer_check_tag((void *)CONCAT44(in_stack_fffffffffffffebc,
                                                    in_stack_fffffffffffffeb8),
                                   in_stack_fffffffffffffeb4,
                                   (char *)CONCAT44(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8));
          in_stack_fffffffffffffed0 = (void *)(ulong)(local_8c - XCT_OPENING);
          switch(in_stack_fffffffffffffed0) {
          case (void *)0x0:
          case (void *)0x2:
            local_74 = local_9c;
            local_68[1] = (short)local_9c;
            *local_68 = 2;
            goto LAB_0015ab93;
          default:
            local_9c = local_78;
            goto LAB_0015ab93;
          case (void *)0x4:
          case (void *)0x6:
            local_9c = local_9c + 1;
          }
        }
LAB_0015ab93:
        if (local_9c != local_78) goto LAB_0015a300;
      }
      else {
        ASN_DEBUG("Out of defined members: %d/%d",(ulong)local_74,(ulong)*(uint *)(local_20 + 0x90))
        ;
      }
      if ((int)local_74 < *(int *)(local_20 + 0x90)) {
        in_stack_fffffffffffffec8 = *(int *)(local_50 + (long)(int)local_74 * 0x40 + 4);
      }
      else {
        in_stack_fffffffffffffec8 = 0;
      }
      if (local_48[10] < (int)(local_74 + in_stack_fffffffffffffec8)) {
        if ((int)local_74 < *(int *)(local_20 + 0x90)) {
          in_stack_fffffffffffffec0 = *(int *)(local_50 + (long)(int)local_74 * 0x40 + 4);
        }
        else {
          in_stack_fffffffffffffec0 = 0;
        }
        if ((int)(local_74 + in_stack_fffffffffffffec0) < local_48[0xb]) {
          in_stack_fffffffffffffec4 = local_74;
          in_stack_fffffffffffffecc = local_74;
          ASN_DEBUG("Got anticipated extension at %d",(ulong)local_74);
          if ((local_8c & XCT_CLOSING) == XCT_BROKEN) {
            local_68[8] = 1;
            local_68[9] = 0;
            local_68[10] = 0;
            local_68[0xb] = 0;
            *local_68 = 3;
          }
          local_38 = local_38 + local_88;
          local_40 = local_40 - local_88;
          local_70 = local_88 + local_70;
          goto LAB_0015a300;
        }
      }
switchD_0015a7f6_caseD_3:
    }
LAB_0015ad34:
    if (local_40 == 0) {
      uVar2 = 0x2e;
    }
    else {
      uVar2 = (uint)*local_38;
    }
    if (local_40 < 2) {
      uVar3 = 0x2e;
    }
    else {
      uVar3 = (uint)local_38[1];
    }
    if (local_40 < 3) {
      uVar4 = 0x2e;
    }
    else {
      uVar4 = (uint)local_38[2];
    }
    if (local_40 < 4) {
      local_15c = 0x2e;
    }
    else {
      local_15c = (uint)local_38[3];
    }
    if (local_40 < 5) {
      local_164 = 0x2e;
    }
    else {
      local_164 = (uint)local_38[4];
    }
    if (local_40 < 6) {
      local_16c = 0x2e;
    }
    else {
      local_16c = (int)local_38[5];
    }
    ASN_DEBUG("Unexpected XML tag in SEQUENCE [%c%c%c%c%c%c]",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4
              ,(ulong)local_15c,(ulong)local_164,local_16c);
    goto LAB_0015ae76;
  }
  local_38 = local_38 + local_88;
  local_40 = local_40 - local_88;
  local_70 = local_88 + local_70;
  *local_68 = 1;
  goto LAB_0015a300;
LAB_0015ae76:
  *local_68 = 4;
  local_10 = 2;
  local_8 = local_70;
LAB_0015ae9e:
  aVar5._4_4_ = 0;
  aVar5.code = local_10;
  aVar5.consumed = local_8;
  return aVar5;
}

Assistant:

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SEQUENCE_specifics_t *specs
		= (asn_SEQUENCE_specifics_t *)td->specifics;
	asn_TYPE_member_t *elements = td->elements;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */
	int edx_end;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);


	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Skipping unknown extensions.
	 * Phase 4: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 3;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;
		int n;

		/*
		 * Go inside the inner member of a sequence.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st + elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Invoke the inner type decoder, m.b. multiple times */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			ctx->phase = 1;	/* Back to body processing */
			ctx->step = ++edx;
			ASN_DEBUG("XER/SEQUENCE phase => %d, step => %d",
				ctx->phase, ctx->step);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size,
			&ch_type);
		if(ch_size == -1) {
		    RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SEQUENCE: tcv = %d, ph=%d [%s]",
			tcv, ctx->phase, xml_tag);

		/* Skip the extensions section */
		if(ctx->phase == 3) {
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 4;
				RETURN(RC_FAIL);
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 1:
				XER_ADVANCE(ch_size);
				ctx->phase = 1;
				continue;
			case 2:
				ctx->phase = 1;
				break;
			}
		}

		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				if(edx >= td->elements_count
				   ||
				   /* Explicit OPTIONAL specs reaches the end */
				    (edx + elements[edx].optional
					== td->elements_count)
				   ||
				   /* All extensions are optional */
				   (IN_EXTENSION_GROUP(specs, edx)
					&& specs->ext_before
						> td->elements_count)
				) {
					XER_ADVANCE(ch_size);
					ctx->phase = 4;	/* Phase out */
					RETURN(RC_OK);
				} else {
					ASN_DEBUG("Premature end of XER SEQUENCE");
					RETURN(RC_FAIL);
				}
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SEQUENCE: tcv=%d, ph=%d, edx=%d",
				tcv, ctx->phase, edx);
			if(ctx->phase != 1) {
				break;	/* Really unexpected */
			}

			if(edx < td->elements_count) {
				/*
				 * Search which member corresponds to this tag.
				 */
				edx_end = edx + elements[edx].optional + 1;
				if(edx_end > td->elements_count)
					edx_end = td->elements_count;
				for(n = edx; n < edx_end; n++) {
					elm = &td->elements[n];
					tcv = xer_check_tag(buf_ptr,
						ch_size, elm->name);
					switch(tcv) {
					case XCT_BOTH:
					case XCT_OPENING:
						/*
						 * Process this member.
						 */
						ctx->step = edx = n;
						ctx->phase = 2;
						break;
					case XCT_UNKNOWN_OP:
					case XCT_UNKNOWN_BO:
						continue;
					default:
						n = edx_end;
						break;	/* Phase out */
					}
					break;
				}
				if(n != edx_end)
					continue;
			} else {
				ASN_DEBUG("Out of defined members: %d/%d",
					edx, td->elements_count);
			}

			/* It is expected extension */
			if(IN_EXTENSION_GROUP(specs,
				edx + (edx < td->elements_count
					? elements[edx].optional : 0))) {
				ASN_DEBUG("Got anticipated extension at %d",
					edx);
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
				} else {
					ctx->left = 1;
					ctx->phase = 3;	/* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SEQUENCE [%c%c%c%c%c%c]",
			size>0?((const char *)buf_ptr)[0]:'.',
			size>1?((const char *)buf_ptr)[1]:'.',
			size>2?((const char *)buf_ptr)[2]:'.',
			size>3?((const char *)buf_ptr)[3]:'.',
			size>4?((const char *)buf_ptr)[4]:'.',
			size>5?((const char *)buf_ptr)[5]:'.');
		break;
	}

	ctx->phase = 4;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}